

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O1

int fffi1i8(uchar *input,long ntodo,double scale,double zero,int nullcheck,uchar tnull,
           LONGLONG nullval,char *nullarray,int *anynull,LONGLONG *output,int *status)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 0.0) {
      if (0 < ntodo) {
        lVar1 = 0;
        do {
          dVar3 = (double)input[lVar1] * scale + zero;
          if (-9.223372036854776e+18 <= dVar3) {
            if (dVar3 <= 9.223372036854776e+18) {
              lVar2 = (long)dVar3;
            }
            else {
              *status = -0xb;
              lVar2 = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            lVar2 = -0x8000000000000000;
          }
          output[lVar1] = lVar2;
          lVar1 = lVar1 + 1;
        } while (ntodo != lVar1);
      }
    }
    else if (0 < ntodo) {
      lVar1 = 0;
      do {
        output[lVar1] = (ulong)input[lVar1];
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (scale != 1.0 || zero != 0.0) {
    if (0 < ntodo) {
      lVar1 = 0;
      do {
        if (input[lVar1] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar1] = nullval;
          }
          else {
            nullarray[lVar1] = '\x01';
          }
        }
        else {
          dVar3 = (double)input[lVar1] * scale + zero;
          if (-9.223372036854776e+18 <= dVar3) {
            if (dVar3 <= 9.223372036854776e+18) {
              output[lVar1] = (long)dVar3;
            }
            else {
              *status = -0xb;
              output[lVar1] = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar1] = -0x8000000000000000;
          }
        }
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (0 < ntodo) {
    lVar1 = 0;
    do {
      if (input[lVar1] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar1] = nullval;
        }
        else {
          nullarray[lVar1] = '\x01';
        }
      }
      else {
        output[lVar1] = (ulong)input[lVar1];
      }
      lVar1 = lVar1 + 1;
    } while (ntodo != lVar1);
  }
  return *status;
}

Assistant:

int fffi1i8(unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
            LONGLONG nullval,     /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            LONGLONG *output,     /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
                output[ii] = (LONGLONG) input[ii];  /* copy input to output */
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DLONGLONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONGLONG_MIN;
                }
                else if (dvalue > DLONGLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONGLONG_MAX;
                }
                else
                    output[ii] = (LONGLONG) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (LONGLONG) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DLONGLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONGLONG_MIN;
                    }
                    else if (dvalue > DLONGLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONGLONG_MAX;
                    }
                    else
                        output[ii] = (LONGLONG) dvalue;
                }
            }
        }
    }
    return(*status);
}